

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DatabasePageSize(int *pRc,Fts3Table *p)

{
  int iVar1;
  sqlite3_stmt *pStmt_00;
  long in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  char *zSql;
  int rc;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  int iVar3;
  sqlite3 *db;
  sqlite3_stmt *pStmt_01;
  
  pStmt_01 = *(sqlite3_stmt **)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    uVar2 = 0xaaaaaaaa;
    db = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
    pStmt_00 = (sqlite3_stmt *)sqlite3_mprintf("PRAGMA %Q.page_size",*(undefined8 *)(in_RSI + 0x20))
    ;
    if (pStmt_00 == (sqlite3_stmt *)0x0) {
      iVar3 = 7;
    }
    else {
      iVar3 = sqlite3_prepare(db,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20),
                              (sqlite3_stmt **)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                              (char **)pStmt_00);
      if (iVar3 == 0) {
        sqlite3_step(pStmt_01);
        iVar1 = sqlite3_column_int(pStmt_00,in_stack_ffffffffffffffcc);
        *(int *)(in_RSI + 0x1d4) = iVar1;
        iVar3 = sqlite3_finalize((sqlite3_stmt *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
      }
      else if (iVar3 == 0x17) {
        *(undefined4 *)(in_RSI + 0x1d4) = 0x400;
        iVar3 = 0;
      }
    }
    sqlite3_free((void *)0x24a3ed);
    *in_RDI = iVar3;
  }
  if (*(sqlite3_stmt **)(in_FS_OFFSET + 0x28) != pStmt_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3DatabasePageSize(int *pRc, Fts3Table *p){
  if( *pRc==SQLITE_OK ){
    int rc;                       /* Return code */
    char *zSql;                   /* SQL text "PRAGMA %Q.page_size" */
    sqlite3_stmt *pStmt;          /* Compiled "PRAGMA %Q.page_size" statement */

    zSql = sqlite3_mprintf("PRAGMA %Q.page_size", p->zDb);
    if( !zSql ){
      rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3_prepare(p->db, zSql, -1, &pStmt, 0);
      if( rc==SQLITE_OK ){
        sqlite3_step(pStmt);
        p->nPgsz = sqlite3_column_int(pStmt, 0);
        rc = sqlite3_finalize(pStmt);
      }else if( rc==SQLITE_AUTH ){
        p->nPgsz = 1024;
        rc = SQLITE_OK;
      }
    }
    assert( p->nPgsz>0 || rc!=SQLITE_OK );
    sqlite3_free(zSql);
    *pRc = rc;
  }
}